

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_interpreted.cpp
# Opt level: O0

void __thiscall
randomx::InterpretedVm<randomx::AlignedAllocator<64UL>,_true>::execute
          (InterpretedVm<randomx::AlignedAllocator<64UL>,_true>_conflict *this)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ProgramConfiguration *in_RDI;
  double extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  rx_vec_f128 adVar5;
  uint i_9;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint64_t spMix;
  uint ic;
  uint32_t spAddr1;
  uint32_t spAddr0;
  uint i;
  NativeRegisterFile nreg;
  ProgramConfiguration *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  uint in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  uint in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  uint uVar6;
  BytecodeMachine *in_stack_fffffffffffffe60;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  NativeRegisterFile local_188;
  uint64_t *local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  uint64_t *local_40;
  double local_38;
  double dStack_30;
  uint64_t *local_20;
  double local_18;
  double dStack_10;
  double *local_8;
  
  NativeRegisterFile::NativeRegisterFile(&local_188);
  for (local_18c = 0; local_18c < 4; local_18c = local_18c + 1) {
    local_80 = in_RDI[0x4c].eMask + (ulong)local_18c * 2;
    dVar1 = (double)local_80[1];
    local_188.a[local_18c][0] = (double)*local_80;
    local_188.a[local_18c][1] = dVar1;
  }
  BytecodeMachine::compileProgram
            (in_stack_fffffffffffffe60,
             (Program *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (InstructionByteCode *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (NativeRegisterFile *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_190 = (uint)in_RDI[0x4f].eMask[0];
  local_194 = *(uint *)((long)in_RDI[0x4f].eMask + 4);
  for (local_198 = 0; local_198 < 0x800; local_198 = local_198 + 1) {
    uVar3 = local_188.r[in_RDI[0x4e].readReg0] ^ local_188.r[in_RDI[0x4e].readReg1];
    uVar2 = (local_194 ^ (uint)(uVar3 >> 0x20)) & 0x1fffc0;
    for (uVar6 = 0; uVar6 < 8; uVar6 = uVar6 + 1) {
      uVar4 = load64((void *)0x16d4f3);
      local_188.r[uVar6] = uVar4 ^ local_188.r[uVar6];
    }
    for (uVar6 = 0; uVar6 < 4; uVar6 = uVar6 + 1) {
      adVar5 = rx_cvt_packed_int_vec_f128
                         ((void *)(*(long *)&in_RDI[0x4f].readReg0 + (ulong)uVar2 +
                                  (ulong)(uVar6 << 3)));
      local_188.f[uVar6][0] = adVar5[0];
      local_188.f[uVar6][1] = extraout_XMM0_Qb;
    }
    for (uVar6 = 0; uVar6 < 4; uVar6 = uVar6 + 1) {
      in_stack_fffffffffffffe28 = in_RDI + 0x4e;
      rx_cvt_packed_int_vec_f128
                ((void *)(*(long *)&in_RDI[0x4f].readReg0 + (ulong)uVar2 + (ulong)((uVar6 + 4) * 8))
                );
      adVar5[0]._4_4_ = in_stack_fffffffffffffe44;
      adVar5[0]._0_4_ = in_stack_fffffffffffffe40;
      adVar5[1]._0_4_ = in_stack_fffffffffffffe48;
      adVar5[1]._4_4_ = in_stack_fffffffffffffe4c;
      adVar5 = BytecodeMachine::maskRegisterExponentMantissa
                         ((ProgramConfiguration *)CONCAT44(uVar6,in_stack_fffffffffffffe50),adVar5);
      local_188.e[uVar6][0] = adVar5[0];
      local_188.e[uVar6][1] = extraout_XMM0_Qb_00;
    }
    BytecodeMachine::executeBytecode
              ((InstructionByteCode *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (uint8_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),in_RDI);
    *(uint *)in_RDI[0x4f].eMask =
         (uint)in_RDI[0x4f].eMask[0] ^
         (uint)local_188.r[in_RDI[0x4e].readReg2] ^ (uint)local_188.r[in_RDI[0x4e].readReg3];
    *(uint *)in_RDI[0x4f].eMask = (uint)in_RDI[0x4f].eMask[0] & 0x7fffffc0;
    (**(code **)(in_RDI->eMask[0] + 0x50))
              (in_RDI,in_RDI[0x50].eMask[0] + (ulong)(uint)in_RDI[0x4f].eMask[0]);
    (**(code **)(in_RDI->eMask[0] + 0x48))
              (in_RDI,in_RDI[0x50].eMask[0] + (ulong)*(uint *)((long)in_RDI[0x4f].eMask + 4),
               &local_188);
    std::swap<unsigned_int>((uint *)(in_RDI + 0x4f),(uint *)((long)in_RDI[0x4f].eMask + 4));
    for (in_stack_fffffffffffffe50 = 0; in_stack_fffffffffffffe50 < 8;
        in_stack_fffffffffffffe50 = in_stack_fffffffffffffe50 + 1) {
      store64(in_RDI,(uint64_t)in_stack_fffffffffffffe28);
    }
    for (in_stack_fffffffffffffe4c = 0; in_stack_fffffffffffffe4c < 4;
        in_stack_fffffffffffffe4c = in_stack_fffffffffffffe4c + 1) {
      local_68 = local_188.f[in_stack_fffffffffffffe4c][0];
      dStack_60 = local_188.f[in_stack_fffffffffffffe4c][1];
      local_78 = local_188.e[in_stack_fffffffffffffe4c][0];
      dStack_70 = local_188.e[in_stack_fffffffffffffe4c][1];
      local_188.f[in_stack_fffffffffffffe4c][0] = (double)((ulong)local_68 ^ (ulong)local_78);
      local_188.f[in_stack_fffffffffffffe4c][1] = (double)((ulong)dStack_60 ^ (ulong)dStack_70);
    }
    for (in_stack_fffffffffffffe48 = 0; in_stack_fffffffffffffe48 < 4;
        in_stack_fffffffffffffe48 = in_stack_fffffffffffffe48 + 1) {
      local_8 = (double *)
                (*(long *)&in_RDI[0x4f].readReg0 + (ulong)((local_190 ^ (uint)uVar3) & 0x1fffc0) +
                (ulong)(in_stack_fffffffffffffe48 << 4));
      local_18 = local_188.f[in_stack_fffffffffffffe48][0];
      dStack_10 = local_188.f[in_stack_fffffffffffffe48][1];
      *local_8 = local_18;
      local_8[1] = dStack_10;
    }
    local_190 = 0;
    local_194 = 0;
  }
  for (uVar2 = 0; uVar2 < 8; uVar2 = uVar2 + 1) {
    store64(in_RDI,(uint64_t)in_stack_fffffffffffffe28);
  }
  for (uVar2 = 0; uVar2 < 4; uVar2 = uVar2 + 1) {
    local_20 = in_RDI[0x48].eMask + (ulong)uVar2 * 2;
    local_38 = local_188.f[uVar2][0];
    dStack_30 = local_188.f[uVar2][1];
    *local_20 = (uint64_t)local_38;
    local_20[1] = (uint64_t)dStack_30;
  }
  for (uVar2 = 0; uVar2 < 4; uVar2 = uVar2 + 1) {
    local_40 = in_RDI[0x4a].eMask + (ulong)uVar2 * 2;
    local_58 = local_188.e[uVar2][0];
    dStack_50 = local_188.e[uVar2][1];
    *local_40 = (uint64_t)local_58;
    local_40[1] = (uint64_t)dStack_50;
  }
  return;
}

Assistant:

void InterpretedVm<Allocator, softAes>::execute() {

		NativeRegisterFile nreg;

		for(unsigned i = 0; i < RegisterCountFlt; ++i)
			nreg.a[i] = rx_load_vec_f128(&reg.a[i].lo);

		compileProgram(program, bytecode, nreg);

		uint32_t spAddr0 = mem.mx;
		uint32_t spAddr1 = mem.ma;

		for(unsigned ic = 0; ic < RANDOMX_PROGRAM_ITERATIONS; ++ic) {
			uint64_t spMix = nreg.r[config.readReg0] ^ nreg.r[config.readReg1];
			spAddr0 ^= spMix;
			spAddr0 &= ScratchpadL3Mask64;
			spAddr1 ^= spMix >> 32;
			spAddr1 &= ScratchpadL3Mask64;
			
			for (unsigned i = 0; i < RegistersCount; ++i)
				nreg.r[i] ^= load64(scratchpad + spAddr0 + 8 * i);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.f[i] = rx_cvt_packed_int_vec_f128(scratchpad + spAddr1 + 8 * i);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.e[i] = maskRegisterExponentMantissa(config, rx_cvt_packed_int_vec_f128(scratchpad + spAddr1 + 8 * (RegisterCountFlt + i)));

			executeBytecode(bytecode, scratchpad, config);

			mem.mx ^= nreg.r[config.readReg2] ^ nreg.r[config.readReg3];
			mem.mx &= CacheLineAlignMask;
			datasetPrefetch(datasetOffset + mem.mx);
			datasetRead(datasetOffset + mem.ma, nreg.r);
			std::swap(mem.mx, mem.ma);

			for (unsigned i = 0; i < RegistersCount; ++i)
				store64(scratchpad + spAddr1 + 8 * i, nreg.r[i]);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				nreg.f[i] = rx_xor_vec_f128(nreg.f[i], nreg.e[i]);

			for (unsigned i = 0; i < RegisterCountFlt; ++i)
				rx_store_vec_f128((double*)(scratchpad + spAddr0 + 16 * i), nreg.f[i]);

			spAddr0 = 0;
			spAddr1 = 0;
		}

		for (unsigned i = 0; i < RegistersCount; ++i)
			store64(&reg.r[i], nreg.r[i]);

		for (unsigned i = 0; i < RegisterCountFlt; ++i)
			rx_store_vec_f128(&reg.f[i].lo, nreg.f[i]);

		for (unsigned i = 0; i < RegisterCountFlt; ++i)
			rx_store_vec_f128(&reg.e[i].lo, nreg.e[i]);
	}